

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O0

DescriptorScriptData * __thiscall
cfd::AddressFactory::ParseOutputDescriptor
          (AddressFactory *this,string *descriptor,string *bip32_derivation_path,
          vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *script_list
          ,vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>
           *multisig_key_list,
          vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list)

{
  bool bVar1;
  uint32_t uVar2;
  DescriptorScriptType DVar3;
  AddressType AVar4;
  uint uVar5;
  DescriptorKeyType DVar6;
  reference pvVar7;
  reference pvVar8;
  string *in_RDX;
  long in_RSI;
  DescriptorScriptData *in_RDI;
  long in_R8;
  long in_R9;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *in_stack_00000008;
  DescriptorKeyData key_data;
  DescriptorKeyReference *ref_1;
  iterator __end2_2;
  iterator __begin2_2;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  *__range2_2;
  DescriptorScriptData data;
  DescriptorScriptReference child;
  uint32_t depth;
  bool is_loop;
  DescriptorScriptReference script_ref;
  DescriptorScriptData ref_data;
  DescriptorScriptReference *ref;
  iterator __end2_1;
  iterator __begin2_1;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  *__range2_1;
  DescriptorKeyReference key_ref;
  bool use_script_list;
  uint32_t multisig_req_num;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  multisig_keys;
  DescriptorNode node;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  script_refs;
  KeyData *key;
  iterator __end2;
  iterator __begin2;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *__range2;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> temp_list;
  uint32_t index;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  Descriptor desc;
  DescriptorScriptData *result;
  DescriptorScriptReference *in_stack_ffffffffffffd9a0;
  undefined4 in_stack_ffffffffffffd9a8;
  undefined4 in_stack_ffffffffffffd9ac;
  string *in_stack_ffffffffffffd9b0;
  DescriptorScriptType in_stack_ffffffffffffd9d0;
  DescriptorScriptType in_stack_ffffffffffffd9d4;
  reference local_2578;
  __normal_iterator<cfd::core::DescriptorKeyReference_*,_std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>_>
  local_2570;
  __normal_iterator<cfd::core::DescriptorKeyReference_*,_std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>_>
  local_2568;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  *local_2560;
  undefined8 in_stack_ffffffffffffdb00;
  undefined8 in_stack_ffffffffffffdb08;
  string local_21f0 [32];
  string local_21d0 [32];
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_21b0;
  Script local_2198;
  Address local_2160;
  Script local_1fe0;
  Script local_1fa8;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_1f70;
  DescriptorScriptReference local_1f58;
  Script local_1bf0;
  DescriptorScriptType local_1bb8;
  Script local_1bb0;
  int local_1b78;
  Address local_1b70;
  AddressType local_19f0;
  Script local_19e8;
  DescriptorKeyType local_19b0;
  string local_19a8 [32];
  uint32_t local_1988;
  DescriptorScriptReference local_1868;
  Script local_1500;
  int local_14c8;
  byte local_14c1;
  DescriptorScriptReference local_14c0;
  SchnorrPubkey local_1158;
  string local_1140;
  Extkey local_1120;
  string local_1090;
  Extkey local_1070;
  string local_fe0;
  TaprootScriptTree local_fc0;
  TapBranch local_f28;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_ea8;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_e90;
  string local_e78 [32];
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_e58;
  string local_e40 [32];
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_e20;
  Script local_e08;
  Address local_dd0;
  Script local_c50;
  DescriptorScriptType local_c18;
  Script local_c10;
  undefined4 local_bd8;
  Address local_bd0;
  AddressType local_a50;
  Script local_a48;
  DescriptorKeyType local_a10;
  string local_a08 [320];
  DescriptorScriptReference *local_8c8;
  __normal_iterator<cfd::core::DescriptorScriptReference_*,_std::vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>_>
  local_8c0;
  __normal_iterator<cfd::core::DescriptorScriptReference_*,_std::vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>_>
  local_8b8;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  *local_8b0;
  DescriptorKeyReference local_8a8;
  byte local_5a5;
  uint32_t local_5a4;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_5a0;
  Script local_588;
  Address local_550;
  Script local_3d0;
  DescriptorNode local_398;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  local_228;
  reference local_210;
  __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
  local_208;
  __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
  local_200;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *local_1f8;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_1f0;
  uint local_1d4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  Descriptor local_1a8;
  byte local_31;
  long local_30;
  long local_28;
  string *local_18;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_18 = in_RDX;
  if (in_R8 != 0) {
    std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::clear
              ((vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)
               0x553d5a);
  }
  if (local_30 != 0) {
    std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::clear
              ((vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)0x553d72);
  }
  local_31 = 0;
  DescriptorScriptData::DescriptorScriptData
            ((DescriptorScriptData *)CONCAT44(in_stack_ffffffffffffd9d4,in_stack_ffffffffffffd9d0));
  in_RDI->key_type = kDescriptorKeyNull;
  in_RDI->address_type = kP2shAddress;
  in_RDI->multisig_req_sig_num = 0;
  core::Descriptor::Parse
            (&local_1a8,local_18,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             (in_RSI + 0x10),*(NetType *)(in_RSI + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x553de3);
  for (local_1d4 = 0; uVar5 = local_1d4, uVar2 = core::Descriptor::GetNeedArgumentNum(&local_1a8),
      uVar5 < uVar2; local_1d4 = local_1d4 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffd9b0,
                (value_type *)CONCAT44(in_stack_ffffffffffffd9ac,in_stack_ffffffffffffd9a8));
  }
  if (in_stack_00000008 != (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)0x0) {
    core::Descriptor::GetKeyDataAll(&local_1f0,&local_1a8,&local_1d0);
    local_1f8 = &local_1f0;
    local_200._M_current =
         (KeyData *)
         std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::begin(local_1f8);
    local_208._M_current =
         (KeyData *)
         std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::end(local_1f8);
    while (bVar1 = __gnu_cxx::operator!=(&local_200,&local_208), bVar1) {
      local_210 = __gnu_cxx::
                  __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
                  ::operator*(&local_200);
      std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::push_back
                (in_stack_00000008,local_210);
      __gnu_cxx::
      __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
      ::operator++(&local_200);
    }
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
               in_stack_ffffffffffffd9b0);
  }
  core::Descriptor::GetReferenceAll(&local_228,&local_1a8,&local_1d0);
  core::Descriptor::GetNode(&local_398,&local_1a8);
  DVar3 = core::DescriptorNode::GetScriptType(&local_398);
  in_RDI->type = DVar3;
  in_RDI->key_type = kDescriptorKeyNull;
  in_RDI->depth = 0;
  pvVar7 = std::
           vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
           ::operator[](&local_228,0);
  core::DescriptorScriptReference::GetLockingScript(&local_3d0,pvVar7);
  core::Script::operator=(&in_RDI->locking_script,&local_3d0);
  core::Script::~Script((Script *)in_stack_ffffffffffffd9a0);
  pvVar7 = std::
           vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
           ::operator[](&local_228,0);
  bVar1 = core::DescriptorScriptReference::HasAddress(pvVar7);
  if (bVar1) {
    pvVar7 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[](&local_228,0);
    core::DescriptorScriptReference::GenerateAddress(&local_550,pvVar7,*(NetType *)(in_RSI + 8));
    core::Address::operator=(&in_RDI->address,&local_550);
    core::Address::~Address((Address *)in_stack_ffffffffffffd9a0);
    pvVar7 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[](&local_228,0);
    AVar4 = core::DescriptorScriptReference::GetAddressType(pvVar7);
    in_RDI->address_type = AVar4;
  }
  pvVar7 = std::
           vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
           ::operator[](&local_228,0);
  bVar1 = core::DescriptorScriptReference::HasRedeemScript(pvVar7);
  if (bVar1) {
    pvVar7 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[](&local_228,0);
    core::DescriptorScriptReference::GetRedeemScript(&local_588,pvVar7);
    core::Script::operator=(&in_RDI->redeem_script,&local_588);
    core::Script::~Script((Script *)in_stack_ffffffffffffd9a0);
  }
  std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ::vector(&local_5a0);
  local_5a4 = 0;
  local_5a5 = 0;
  core::DescriptorKeyReference::DescriptorKeyReference(&local_8a8);
  uVar5 = in_RDI->type - kDescriptorScriptSh;
  if (10 < uVar5 && in_RDI->type != kDescriptorScriptTaproot) goto switchD_00554276_caseD_554b8e;
  switch((long)&switchD_00554276::switchdataD_008b48d8 +
         (long)(int)(&switchD_00554276::switchdataD_008b48d8)[uVar5]) {
  case 0x554291:
    local_8b0 = &local_228;
    local_8b8._M_current =
         (DescriptorScriptReference *)
         std::
         vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
         ::begin(local_8b0);
    local_8c0._M_current =
         (DescriptorScriptReference *)
         std::
         vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
         ::end(local_8b0);
    while (bVar1 = __gnu_cxx::operator!=(&local_8b8,&local_8c0), bVar1) {
      local_8c8 = __gnu_cxx::
                  __normal_iterator<cfd::core::DescriptorScriptReference_*,_std::vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>_>
                  ::operator*(&local_8b8);
      DescriptorScriptData::DescriptorScriptData
                ((DescriptorScriptData *)
                 CONCAT44(in_stack_ffffffffffffd9d4,in_stack_ffffffffffffd9d0));
      local_c18 = core::DescriptorScriptReference::GetScriptType(local_8c8);
      local_bd8 = 0;
      core::DescriptorScriptReference::GetLockingScript(&local_c50,local_8c8);
      core::Script::operator=(&local_c10,&local_c50);
      core::Script::~Script((Script *)in_stack_ffffffffffffd9a0);
      bVar1 = core::DescriptorScriptReference::HasAddress(local_8c8);
      if (bVar1) {
        core::DescriptorScriptReference::GenerateAddress
                  (&local_dd0,local_8c8,*(NetType *)(in_RSI + 8));
        core::Address::operator=(&local_bd0,&local_dd0);
        core::Address::~Address((Address *)in_stack_ffffffffffffd9a0);
        local_a50 = core::DescriptorScriptReference::GetAddressType(local_8c8);
      }
      else {
        local_a50 = kP2shAddress;
      }
      bVar1 = core::DescriptorScriptReference::HasRedeemScript(local_8c8);
      if (bVar1) {
        core::DescriptorScriptReference::GetRedeemScript(&local_e08,local_8c8);
        core::Script::operator=(&local_a48,&local_e08);
        core::Script::~Script((Script *)in_stack_ffffffffffffd9a0);
        local_a10 = kDescriptorKeyNull;
      }
      else {
        core::DescriptorScriptReference::GetKeyList(&local_e20,local_8c8);
        pvVar8 = std::
                 vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                 ::operator[](&local_e20,0);
        core::DescriptorKeyReference::operator=(&local_8a8,pvVar8);
        std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   *)in_stack_ffffffffffffd9b0);
        local_a10 = core::DescriptorKeyReference::GetKeyType(&local_8a8);
        const::$_0::operator()::DescriptorKeyReference_const___const
                  ((anon_class_1_0_00000001 *)in_stack_ffffffffffffdb08,
                   (DescriptorKeyReference *)in_stack_ffffffffffffdb00);
        std::__cxx11::string::operator=(local_a08,local_e40);
        std::__cxx11::string::~string(local_e40);
        if (in_RDI->key_type == kDescriptorKeyNull) {
          in_RDI->key_type = local_a10;
          std::__cxx11::string::operator=((string *)&in_RDI->key,local_a08);
        }
      }
      if (local_28 != 0) {
        std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::
        push_back((vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)
                  in_stack_ffffffffffffd9b0,
                  (value_type *)CONCAT44(in_stack_ffffffffffffd9ac,in_stack_ffffffffffffd9a8));
      }
      DescriptorScriptData::~DescriptorScriptData((DescriptorScriptData *)in_stack_ffffffffffffd9a0)
      ;
      __gnu_cxx::
      __normal_iterator<cfd::core::DescriptorScriptReference_*,_std::vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>_>
      ::operator++(&local_8b8);
    }
    break;
  case 0x554692:
    local_5a5 = 1;
    break;
  case 0x55469f:
    pvVar7 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[](&local_228,0);
    core::DescriptorScriptReference::GetKeyList(&local_e58,pvVar7);
    pvVar8 = std::
             vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             ::operator[](&local_e58,0);
    core::DescriptorKeyReference::operator=(&local_8a8,pvVar8);
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)in_stack_ffffffffffffd9b0);
    DVar6 = core::DescriptorKeyReference::GetKeyType(&local_8a8);
    in_RDI->key_type = DVar6;
    const::$_0::operator()::DescriptorKeyReference_const___const
              ((anon_class_1_0_00000001 *)in_stack_ffffffffffffdb08,
               (DescriptorKeyReference *)in_stack_ffffffffffffdb00);
    std::__cxx11::string::operator=((string *)&in_RDI->key,local_e78);
    std::__cxx11::string::~string(local_e78);
    break;
  case 0x554789:
    pvVar7 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[](&local_228,0);
    core::DescriptorScriptReference::GetKeyList(&local_e90,pvVar7);
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    operator=((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
               *)in_stack_ffffffffffffd9b0,
              (vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
               *)CONCAT44(in_stack_ffffffffffffd9ac,in_stack_ffffffffffffd9a8));
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)in_stack_ffffffffffffd9b0);
    pvVar7 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[](&local_228,0);
    uVar2 = core::DescriptorScriptReference::GetReqNum(pvVar7);
    in_RDI->multisig_req_sig_num = uVar2;
    break;
  case 0x554806:
    pvVar7 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[](&local_228,0);
    core::DescriptorScriptReference::GetKeyList(&local_ea8,pvVar7);
    pvVar8 = std::
             vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             ::operator[](&local_ea8,0);
    core::DescriptorKeyReference::operator=(&local_8a8,pvVar8);
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)in_stack_ffffffffffffd9b0);
    pvVar7 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[](&local_228,0);
    core::DescriptorScriptReference::GetTapBranch(&local_f28,pvVar7);
    core::TapBranch::operator=(&in_RDI->branch,&local_f28);
    core::TapBranch::~TapBranch((TapBranch *)in_stack_ffffffffffffd9a0);
    pvVar7 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[](&local_228,0);
    core::DescriptorScriptReference::GetScriptTree(&local_fc0,pvVar7);
    core::TaprootScriptTree::operator=(&in_RDI->tree,&local_fc0);
    core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)in_stack_ffffffffffffd9a0);
    DVar6 = core::DescriptorKeyReference::GetKeyType(&local_8a8);
    in_RDI->key_type = DVar6;
    bVar1 = core::DescriptorKeyReference::HasExtPrivkey(&local_8a8);
    if (bVar1) {
      core::DescriptorKeyReference::GetExtPrivkey((ExtPrivkey *)&local_1070,&local_8a8);
      core::Extkey::ToString_abi_cxx11_(&local_fe0,&local_1070);
      std::__cxx11::string::operator=((string *)&in_RDI->key,(string *)&local_fe0);
      std::__cxx11::string::~string((string *)&local_fe0);
      core::ExtPrivkey::~ExtPrivkey((ExtPrivkey *)0x55499e);
    }
    else {
      bVar1 = core::DescriptorKeyReference::HasExtPubkey(&local_8a8);
      if (bVar1) {
        core::DescriptorKeyReference::GetExtPubkey((ExtPubkey *)&local_1120,&local_8a8);
        core::Extkey::ToString_abi_cxx11_(&local_1090,&local_1120);
        std::__cxx11::string::operator=((string *)&in_RDI->key,(string *)&local_1090);
        std::__cxx11::string::~string((string *)&local_1090);
        core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x554abf);
      }
      else {
        in_RDI->key_type = kDescriptorKeySchnorr;
        core::DescriptorKeyReference::GetSchnorrPubkey(&local_1158,&local_8a8);
        core::SchnorrPubkey::GetHex_abi_cxx11_(&local_1140,&local_1158);
        std::__cxx11::string::operator=((string *)&in_RDI->key,(string *)&local_1140);
        std::__cxx11::string::~string((string *)&local_1140);
        core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x554b60);
      }
    }
    break;
  case 0x554b8c:
  case 0x554b8e:
switchD_00554276_caseD_554b8e:
  }
  if ((local_5a5 & 1) != 0) {
    pvVar7 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[](&local_228,0);
    core::DescriptorScriptReference::DescriptorScriptReference(&local_14c0,pvVar7);
    local_14c1 = core::DescriptorScriptReference::HasChild(&local_14c0);
    local_14c8 = 0;
    if ((bool)local_14c1) {
      core::Script::Script(&local_1500);
    }
    else {
      core::DescriptorScriptReference::GetRedeemScript(&local_1500,&local_14c0);
    }
    core::Script::operator=(&in_RDI->redeem_script,&local_1500);
    core::Script::~Script((Script *)in_stack_ffffffffffffd9a0);
    while ((local_14c1 & 1) != 0) {
      core::DescriptorScriptReference::DescriptorScriptReference(&local_1868);
      DescriptorScriptData::DescriptorScriptData
                ((DescriptorScriptData *)
                 CONCAT44(in_stack_ffffffffffffd9d4,in_stack_ffffffffffffd9d0));
      DVar3 = core::DescriptorScriptReference::GetScriptType(&local_14c0);
      if (DVar3 - kDescriptorScriptSh < 2) {
        bVar1 = core::DescriptorScriptReference::HasChild(&local_14c0);
        if (bVar1) {
          core::DescriptorScriptReference::GetChild(&local_1f58,&local_14c0);
          core::DescriptorScriptReference::operator=(&local_1868,&local_1f58);
          core::DescriptorScriptReference::~DescriptorScriptReference(in_stack_ffffffffffffd9a0);
          DVar3 = core::DescriptorScriptReference::GetScriptType(&local_1868);
          if ((DVar3 == kDescriptorScriptMulti) ||
             (DVar3 = core::DescriptorScriptReference::GetScriptType(&local_1868),
             DVar3 == kDescriptorScriptSortedMulti)) {
            core::DescriptorScriptReference::GetKeyList(&local_1f70,&local_1868);
            std::
            vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
            ::operator=((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                         *)in_stack_ffffffffffffd9b0,
                        (vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                         *)CONCAT44(in_stack_ffffffffffffd9ac,in_stack_ffffffffffffd9a8));
            std::
            vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
            ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                       *)in_stack_ffffffffffffd9b0);
            local_5a4 = core::DescriptorScriptReference::GetReqNum(&local_1868);
            in_RDI->multisig_req_sig_num = local_5a4;
            local_14c1 = 0;
          }
          else {
            in_stack_ffffffffffffd9d4 = core::DescriptorScriptReference::GetScriptType(&local_1868);
            if (in_stack_ffffffffffffd9d4 == kDescriptorScriptMiniscript) {
              local_14c1 = 0;
            }
          }
          in_stack_ffffffffffffd9d0 = core::DescriptorScriptReference::GetScriptType(&local_1868);
          if (in_stack_ffffffffffffd9d0 != kDescriptorScriptWpkh) {
            core::DescriptorScriptReference::GetRedeemScript(&local_1fa8,&local_14c0);
            core::Script::operator=(&in_RDI->redeem_script,&local_1fa8);
            core::Script::~Script((Script *)in_stack_ffffffffffffd9a0);
          }
        }
        else {
          core::DescriptorScriptReference::GetRedeemScript(&local_1bf0,&local_14c0);
          core::Script::operator=(&in_RDI->redeem_script,&local_1bf0);
          core::Script::~Script((Script *)in_stack_ffffffffffffd9a0);
        }
      }
      else {
        local_14c1 = 0;
      }
      local_1bb8 = core::DescriptorScriptReference::GetScriptType(&local_14c0);
      local_1b78 = local_14c8;
      core::DescriptorScriptReference::GetLockingScript(&local_1fe0,&local_14c0);
      core::Script::operator=(&local_1bb0,&local_1fe0);
      core::Script::~Script((Script *)in_stack_ffffffffffffd9a0);
      core::DescriptorScriptReference::GenerateAddress
                (&local_2160,&local_14c0,*(NetType *)(in_RSI + 8));
      core::Address::operator=(&local_1b70,&local_2160);
      core::Address::~Address((Address *)in_stack_ffffffffffffd9a0);
      local_19f0 = core::DescriptorScriptReference::GetAddressType(&local_14c0);
      bVar1 = core::DescriptorScriptReference::HasRedeemScript(&local_14c0);
      if (bVar1) {
        core::DescriptorScriptReference::GetRedeemScript(&local_2198,&local_14c0);
        core::Script::operator=(&local_19e8,&local_2198);
        core::Script::~Script((Script *)in_stack_ffffffffffffd9a0);
      }
      bVar1 = core::DescriptorScriptReference::HasKey(&local_14c0);
      if (bVar1) {
        core::DescriptorScriptReference::GetKeyList(&local_21b0,&local_14c0);
        pvVar8 = std::
                 vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                 ::operator[](&local_21b0,0);
        core::DescriptorKeyReference::operator=(&local_8a8,pvVar8);
        std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   *)in_stack_ffffffffffffd9b0);
        local_19b0 = core::DescriptorKeyReference::GetKeyType(&local_8a8);
        const::$_0::operator()::DescriptorKeyReference_const___const
                  ((anon_class_1_0_00000001 *)in_stack_ffffffffffffdb08,
                   (DescriptorKeyReference *)in_stack_ffffffffffffdb00);
        in_stack_ffffffffffffd9b0 = local_21d0;
        std::__cxx11::string::operator=(local_19a8,in_stack_ffffffffffffd9b0);
        std::__cxx11::string::~string(in_stack_ffffffffffffd9b0);
        DVar6 = core::DescriptorKeyReference::GetKeyType(&local_8a8);
        in_RDI->key_type = DVar6;
        const::$_0::operator()::DescriptorKeyReference_const___const
                  ((anon_class_1_0_00000001 *)in_stack_ffffffffffffdb08,
                   (DescriptorKeyReference *)in_stack_ffffffffffffdb00);
        std::__cxx11::string::operator=((string *)&in_RDI->key,local_21f0);
        std::__cxx11::string::~string(local_21f0);
      }
      else {
        local_19b0 = kDescriptorKeyNull;
      }
      local_1988 = local_5a4;
      if (local_28 != 0) {
        std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::
        push_back((vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)
                  in_stack_ffffffffffffd9b0,
                  (value_type *)CONCAT44(in_stack_ffffffffffffd9ac,in_stack_ffffffffffffd9a8));
      }
      if ((local_14c1 & 1) == 0) {
LAB_0055534a:
        local_14c1 = 0;
      }
      else {
        bVar1 = core::DescriptorScriptReference::HasChild(&local_14c0);
        in_stack_ffffffffffffd9ac = CONCAT13(bVar1,(int3)in_stack_ffffffffffffd9ac);
        if (!bVar1) goto LAB_0055534a;
        core::DescriptorScriptReference::GetChild
                  ((DescriptorScriptReference *)&stack0xffffffffffffdaa8,&local_14c0);
        core::DescriptorScriptReference::operator=
                  (&local_1868,(DescriptorScriptReference *)&stack0xffffffffffffdaa8);
        core::DescriptorScriptReference::~DescriptorScriptReference(in_stack_ffffffffffffd9a0);
        core::DescriptorScriptReference::operator=(&local_14c0,&local_1868);
        local_14c8 = local_14c8 + 1;
      }
      DescriptorScriptData::~DescriptorScriptData((DescriptorScriptData *)in_stack_ffffffffffffd9a0)
      ;
      core::DescriptorScriptReference::~DescriptorScriptReference(in_stack_ffffffffffffd9a0);
    }
    core::DescriptorScriptReference::~DescriptorScriptReference(in_stack_ffffffffffffd9a0);
  }
  bVar1 = std::
          vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
          ::empty(&local_5a0);
  if ((!bVar1) && (local_30 != 0)) {
    local_2560 = &local_5a0;
    local_2568._M_current =
         (DescriptorKeyReference *)
         std::
         vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
         ::begin(local_2560);
    local_2570._M_current =
         (DescriptorKeyReference *)
         std::
         vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
         ::end(local_2560);
    while (bVar1 = __gnu_cxx::operator!=(&local_2568,&local_2570), bVar1) {
      local_2578 = __gnu_cxx::
                   __normal_iterator<cfd::core::DescriptorKeyReference_*,_std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>_>
                   ::operator*(&local_2568);
      in_stack_ffffffffffffd9a0 = (DescriptorScriptReference *)&stack0xffffffffffffda60;
      DVar6 = core::DescriptorKeyReference::GetKeyType(local_2578);
      in_stack_ffffffffffffd9a0->script_type_ = DVar6;
      const::$_0::operator()::DescriptorKeyReference_const___const
                ((anon_class_1_0_00000001 *)in_stack_ffffffffffffdb08,
                 (DescriptorKeyReference *)in_stack_ffffffffffffdb00);
      std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::push_back
                ((vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)
                 in_stack_ffffffffffffd9b0,(value_type *)CONCAT44(in_stack_ffffffffffffd9ac,DVar6));
      DescriptorKeyData::~DescriptorKeyData((DescriptorKeyData *)0x5554ac);
      __gnu_cxx::
      __normal_iterator<cfd::core::DescriptorKeyReference_*,_std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>_>
      ::operator++(&local_2568);
    }
  }
  local_31 = 1;
  core::DescriptorKeyReference::~DescriptorKeyReference
            ((DescriptorKeyReference *)in_stack_ffffffffffffd9a0);
  std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)in_stack_ffffffffffffd9b0);
  core::DescriptorNode::~DescriptorNode((DescriptorNode *)in_stack_ffffffffffffd9a0);
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::~vector(&local_228);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd9b0);
  core::Descriptor::~Descriptor((Descriptor *)0x555539);
  if ((local_31 & 1) == 0) {
    DescriptorScriptData::~DescriptorScriptData((DescriptorScriptData *)in_stack_ffffffffffffd9a0);
  }
  return in_RDI;
}

Assistant:

DescriptorScriptData AddressFactory::ParseOutputDescriptor(
    const std::string& descriptor, const std::string& bip32_derivation_path,
    std::vector<DescriptorScriptData>* script_list,
    std::vector<DescriptorKeyData>* multisig_key_list,
    std::vector<KeyData>* key_list) const {
  if (script_list != nullptr) script_list->clear();
  if (multisig_key_list != nullptr) multisig_key_list->clear();

  static auto get_keystr_function =
      [](const DescriptorKeyReference& key_ref) -> std::string {
    if (key_ref.HasExtPrivkey()) {
      return key_ref.GetExtPrivkey().ToString();
    } else if (key_ref.HasExtPubkey()) {
      return key_ref.GetExtPubkey().ToString();
    } else {
      return key_ref.GetPubkey().GetHex();
    }
  };

  DescriptorScriptData result;
  result.key_type = DescriptorKeyType::kDescriptorKeyNull;  // dummy init
  result.address_type = AddressType::kP2shAddress;          // dummy init
  result.multisig_req_sig_num = 0;
  Descriptor desc = Descriptor::Parse(descriptor, &prefix_list_, type_);
  std::vector<std::string> args;
  for (uint32_t index = 0; index < desc.GetNeedArgumentNum(); ++index) {
    args.push_back(bip32_derivation_path);
  }
  if (key_list != nullptr) {
    auto temp_list = desc.GetKeyDataAll(&args);
    for (const auto& key : temp_list) {
      key_list->push_back(key);
    }
  }
  std::vector<DescriptorScriptReference> script_refs =
      desc.GetReferenceAll(&args);
  DescriptorNode node = desc.GetNode();

  result.type = node.GetScriptType();
  result.key_type = DescriptorKeyType::kDescriptorKeyNull;
  result.depth = 0;
  result.locking_script = script_refs[0].GetLockingScript();
  if (script_refs[0].HasAddress()) {
    result.address = script_refs[0].GenerateAddress(type_);
    result.address_type = script_refs[0].GetAddressType();
  }
  if (script_refs[0].HasRedeemScript()) {
    result.redeem_script = script_refs[0].GetRedeemScript();
  }

  std::vector<DescriptorKeyReference> multisig_keys;
  uint32_t multisig_req_num = 0;
  bool use_script_list = false;
  DescriptorKeyReference key_ref;
  switch (result.type) {
    case DescriptorScriptType::kDescriptorScriptCombo:
      for (const auto& ref : script_refs) {
        DescriptorScriptData ref_data;
        ref_data.type = ref.GetScriptType();
        ref_data.depth = 0;
        ref_data.locking_script = ref.GetLockingScript();
        if (ref.HasAddress()) {
          ref_data.address = ref.GenerateAddress(type_);
          ref_data.address_type = ref.GetAddressType();
        } else {
          ref_data.address_type = AddressType::kP2shAddress;  // dummy init
        }
        if (ref.HasRedeemScript()) {
          ref_data.redeem_script = ref.GetRedeemScript();
          ref_data.key_type = DescriptorKeyType::kDescriptorKeyNull;
        } else {
          key_ref = ref.GetKeyList()[0];
          ref_data.key_type = key_ref.GetKeyType();
          ref_data.key = get_keystr_function(key_ref);
          if (result.key_type == DescriptorKeyType::kDescriptorKeyNull) {
            result.key_type = ref_data.key_type;
            result.key = ref_data.key;
          }
        }
        if (script_list != nullptr) script_list->push_back(ref_data);
      }
      break;
    case DescriptorScriptType::kDescriptorScriptSh:
    case DescriptorScriptType::kDescriptorScriptWsh:
      use_script_list = true;
      break;
    case DescriptorScriptType::kDescriptorScriptPk:
    case DescriptorScriptType::kDescriptorScriptPkh:
    case DescriptorScriptType::kDescriptorScriptWpkh:
      key_ref = script_refs[0].GetKeyList()[0];
      result.key_type = key_ref.GetKeyType();
      result.key = get_keystr_function(key_ref);
      break;
    case DescriptorScriptType::kDescriptorScriptMulti:
    case DescriptorScriptType::kDescriptorScriptSortedMulti:
      multisig_keys = script_refs[0].GetKeyList();
      result.multisig_req_sig_num = script_refs[0].GetReqNum();
      break;
    case DescriptorScriptType::kDescriptorScriptTaproot:
      key_ref = script_refs[0].GetKeyList()[0];
      result.branch = script_refs[0].GetTapBranch();
      result.tree = script_refs[0].GetScriptTree();
      result.key_type = key_ref.GetKeyType();
      if (key_ref.HasExtPrivkey()) {
        result.key = key_ref.GetExtPrivkey().ToString();
      } else if (key_ref.HasExtPubkey()) {
        result.key = key_ref.GetExtPubkey().ToString();
      } else {
        result.key_type = DescriptorKeyType::kDescriptorKeySchnorr;
        result.key = key_ref.GetSchnorrPubkey().GetHex();
      }
      break;
    case DescriptorScriptType::kDescriptorScriptRaw:
    case DescriptorScriptType::kDescriptorScriptAddr:
    default:
      break;
  }

  if (use_script_list) {
    DescriptorScriptReference script_ref = script_refs[0];
    bool is_loop = script_ref.HasChild();
    uint32_t depth = 0;
    result.redeem_script = (is_loop) ? Script() : script_ref.GetRedeemScript();
    while (is_loop) {
      DescriptorScriptReference child;
      DescriptorScriptData data;
      switch (script_ref.GetScriptType()) {
        case DescriptorScriptType::kDescriptorScriptSh:
        case DescriptorScriptType::kDescriptorScriptWsh:
          if (!script_ref.HasChild()) {
            result.redeem_script = script_ref.GetRedeemScript();
          } else {
            child = script_ref.GetChild();
            if ((child.GetScriptType() ==
                 DescriptorScriptType::kDescriptorScriptMulti) ||
                (child.GetScriptType() ==
                 DescriptorScriptType::kDescriptorScriptSortedMulti)) {
              multisig_keys = child.GetKeyList();
              multisig_req_num = child.GetReqNum();
              result.multisig_req_sig_num = multisig_req_num;
              is_loop = false;
            } else if (
                child.GetScriptType() ==
                DescriptorScriptType::kDescriptorScriptMiniscript) {
              is_loop = false;
            }
            if (child.GetScriptType() !=
                DescriptorScriptType::kDescriptorScriptWpkh) {
              result.redeem_script = script_ref.GetRedeemScript();
            }
          }
          break;
        // case DescriptorScriptType::kDescriptorScriptPk:
        // case DescriptorScriptType::kDescriptorScriptPkh:
        // case DescriptorScriptType::kDescriptorScriptWpkh:
        default:
          is_loop = false;
          break;
      }
      data.type = script_ref.GetScriptType();
      data.depth = depth;
      data.locking_script = script_ref.GetLockingScript();
      data.address = script_ref.GenerateAddress(type_);
      data.address_type = script_ref.GetAddressType();
      if (script_ref.HasRedeemScript()) {
        data.redeem_script = script_ref.GetRedeemScript();
      }
      if (script_ref.HasKey()) {
        key_ref = script_ref.GetKeyList()[0];
        data.key_type = key_ref.GetKeyType();
        data.key = get_keystr_function(key_ref);
        result.key_type = key_ref.GetKeyType();
        result.key = get_keystr_function(key_ref);
      } else {
        data.key_type = DescriptorKeyType::kDescriptorKeyNull;
      }
      data.multisig_req_sig_num = multisig_req_num;

      if (script_list != nullptr) script_list->push_back(data);
      if (is_loop && script_ref.HasChild()) {
        child = script_ref.GetChild();
        script_ref = child;
        ++depth;
      } else {
        is_loop = false;
      }
    }
  }

  if ((!multisig_keys.empty()) && multisig_key_list) {
    for (const auto& ref : multisig_keys) {
      DescriptorKeyData key_data{ref.GetKeyType(), get_keystr_function(ref)};
      multisig_key_list->push_back(key_data);
    }
  }
  return result;
}